

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O1

void __thiscall Scs::Server::RunConnection(Server *this,ClientConnectionPtr *connection)

{
  element_type *peVar1;
  void *pvVar2;
  element_type *__args_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)> *this_00;
  bool bVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  size_t __new_size;
  undefined8 uVar9;
  BufferPtr receivedData;
  BufferPtr receiveBuffer;
  undefined1 local_78 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Elt_pointer local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)> *local_38;
  
  lVar6 = std::chrono::_V2::system_clock::now();
  lVar8 = this->m_timeoutMs;
  CreateBuffer();
  std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._16_8_,0x20000);
  if (((connection->super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->connected == true) {
    lVar6 = lVar8 * 1000000 + lVar6;
    local_38 = &this->m_onReceiveData;
    do {
      if (((this->m_shutDown)._M_base._M_i & 1U) != 0) break;
      local_78._0_8_ = (_Elt_pointer)0x0;
      local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3e8;
      do {
        iVar5 = nanosleep((timespec *)local_78,(timespec *)local_78);
        if (iVar5 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      lVar8 = std::chrono::_V2::system_clock::now();
      peVar1 = (connection->
               super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      if (lVar6 <= lVar8) {
        LogWriteLine("Client %d timed out. Closing connection.",(ulong)(uint)peVar1->clientID);
LAB_0010741e:
        ((connection->super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr)->connected = false;
        break;
      }
      bVar4 = Socket::IsWritable((peVar1->socket).
                                 super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if ((bVar4) &&
         (bVar4 = SendQueue::Empty(&((connection->
                                     super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->sendQueue), !bVar4)) {
        peVar1 = (connection->
                 super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_78._32_8_ =
             (peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_50 = (peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_50->_M_use_count = local_50->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_50->_M_use_count = local_50->_M_use_count + 1;
          }
        }
        bVar4 = SendQueue::Send(&peVar1->sendQueue,(SocketPtr *)(local_78 + 0x20));
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        if (!bVar4) {
          LogWriteLine("Error sending data to client.  Shutting down connection.");
          goto LAB_0010741e;
        }
        local_78._0_8_ = (_Elt_pointer)0x0;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x989680;
        do {
          iVar5 = nanosleep((timespec *)local_78,(timespec *)local_78);
          if (iVar5 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        lVar6 = std::chrono::_V2::system_clock::now();
        lVar6 = this->m_timeoutMs * 1000000 + lVar6;
      }
      bVar4 = Socket::IsReadable((((connection->
                                   super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->socket).
                                 super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      if (bVar4) {
        std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._16_8_,
                   *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                              local_78._16_8_)->_M_impl).field_0x10 -
                   *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                             local_78._16_8_)->_M_impl);
        pvVar2 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                            local_78._16_8_)->_M_impl;
        __new_size = Socket::Receive((((connection->
                                       super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->socket).
                                     super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr,pvVar2,
                                     *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                                  *)local_78._16_8_)->_M_impl).field_0x8 -
                                     (long)pvVar2,0);
        if (__new_size != 0) {
          std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_Scs::Allocator<unsigned_char>_> *)local_78._16_8_,
                     __new_size);
          pvVar2 = *(void **)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                              local_78._16_8_)->_M_impl;
          ReceiveQueue::Push(&((connection->
                               super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->receiveQueue,pvVar2,
                             *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>
                                          *)local_78._16_8_)->_M_impl).field_0x8 - (long)pvVar2);
          lVar8 = *(long *)&((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                            local_78._16_8_)->_M_impl;
          if (*(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                         local_78._16_8_)->_M_impl).field_0x8 != lVar8) {
            *(long *)&(((_Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_> *)
                       local_78._16_8_)->_M_impl).field_0x8 = lVar8;
          }
          ReceiveQueue::Pop((ReceiveQueue *)local_78);
          this_00 = local_38;
          while ((_Elt_pointer)local_78._0_8_ != (_Elt_pointer)0x0) {
            if ((this->m_onReceiveData).super__Function_base._M_manager != (_Manager_type)0x0) {
              iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_notifierMutex);
              if (iVar5 != 0) {
                std::__throw_system_error(iVar5);
              }
              __args_2 = ((__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                           *)local_78._0_8_)->_M_ptr;
              std::function<void_(Scs::IServer_&,_int,_const_void_*,_unsigned_long)>::operator()
                        (this_00,&this->super_IServer,
                         ((connection->
                          super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->clientID,__args_2,
                         (long)(((__shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  *)local_78._0_8_)->_M_refcount)._M_pi - (long)__args_2);
              pthread_mutex_unlock((pthread_mutex_t *)&this->m_notifierMutex);
            }
            ReceiveQueue::Pop((ReceiveQueue *)&stack0xffffffffffffffb8);
            p_Var3 = p_Stack_40;
            local_78._0_8_ = local_48;
            uVar9 = local_78._8_8_;
            local_48 = (_Elt_pointer)0x0;
            p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78._8_8_ = p_Var3;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9);
            }
            if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
            }
          }
          lVar6 = std::chrono::_V2::system_clock::now();
          lVar8 = this->m_timeoutMs;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
          lVar6 = lVar8 * 1000000 + lVar6;
        }
      }
    } while (((connection->
              super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->connected != false);
  }
  if ((this->m_onDisconnect).super__Function_base._M_manager != (_Manager_type)0x0) {
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_notifierMutex);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    local_78._0_4_ =
         ((connection->super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr)->clientID;
    if ((this->m_onDisconnect).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar9 = std::__throw_bad_function_call();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
      }
      _Unwind_Resume(uVar9);
    }
    (*(this->m_onDisconnect)._M_invoker)
              ((_Any_data *)&this->m_onDisconnect,&this->super_IServer,(int *)local_78);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_notifierMutex);
  }
  peVar1 = (connection->
           super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var3 = (peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (peVar1->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  LogWriteLine("Closing client %d connection thread.",
               (ulong)(uint)((connection->
                             super___shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->clientID);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._24_8_);
  }
  return;
}

Assistant:

void Server::RunConnection(ClientConnectionPtr connection)
{
	// Set timeout point
	auto timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);

	// Create a receive buffer
	BufferPtr receiveBuffer = CreateBuffer();
	receiveBuffer->reserve(RECEIVE_BUFFER_SIZE);

	// Each client connection runs in a separate thread, controlled
	// by this function.
	while (connection->connected && !m_shutDown)
	{
		// Don't burn too much CPU while idling
		std::this_thread::sleep_for(std::chrono::microseconds(1));

		// Check for connection timeout.  We don't want to keep this connection thread
		// alive if we're not actively sending or receiving data to the client.
		if (std::chrono::system_clock::now() >= timeoutTime)
		{
			LogWriteLine("Client %d timed out. Closing connection.", connection->clientID);
			connection->connected = false;
			break;
		}

		// Check first to see if we can write to the socket
		if (connection->socket->IsWritable())
		{
			if (!connection->sendQueue.Empty())
			{
				if (!connection->sendQueue.Send(connection->socket))
				{
					LogWriteLine("Error sending data to client.  Shutting down connection.");
					connection->connected = false;
					break;
				}

				// We need to throttle our connection transmission rate
				std::this_thread::sleep_for(std::chrono::milliseconds(SEND_THROTTLE_MS));

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}

		// Check for incoming data
		if (connection->socket->IsReadable())
		{
			// Read data from socket
			receiveBuffer->resize(receiveBuffer->capacity());
			size_t bytesReceived = connection->socket->Receive(receiveBuffer->data(), receiveBuffer->size(), 0);
			if (bytesReceived)
			{
				// Push data into the receive queue
				receiveBuffer->resize(bytesReceived);
				connection->receiveQueue.Push(receiveBuffer->data(), receiveBuffer->size());
				receiveBuffer->clear();

				// Process data in receive queue
				BufferPtr receivedData = connection->receiveQueue.Pop();
				while (receivedData)
				{
					if (m_onReceiveData)
					{
						std::lock_guard<std::mutex> lock(m_notifierMutex);
						m_onReceiveData(*this, connection->clientID, receivedData->data(), receivedData->size());
					}
					receivedData = connection->receiveQueue.Pop();
				}		

				// Reset timeout
				timeoutTime = std::chrono::system_clock::now() + std::chrono::milliseconds(m_timeoutMs);
			}
		}
	}

	// We're shutting down, so make sure all sockets are disconnected
	// and the connection data structure is removed from the connection
	// list and deleted.
	if (m_onDisconnect)
	{
		std::lock_guard<std::mutex> lock(m_notifierMutex);
		m_onDisconnect(*this, connection->clientID);
	}
	connection->socket = nullptr;
	LogWriteLine("Closing client %d connection thread.", connection->clientID);
}